

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escape_string.cpp
# Opt level: O1

string_view libtorrent::trim(string_view str)

{
  void *pvVar1;
  size_type sVar2;
  ulong uVar3;
  char *in_RSI;
  ulong in_RDI;
  ulong uVar4;
  string_view sVar5;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  
  uVar3 = 0xffffffffffffffff;
  local_38._M_len = in_RDI;
  local_38._M_str = in_RSI;
  if (in_RDI != 0) {
    uVar4 = 0;
    do {
      pvVar1 = memchr(" \t\n\r",(int)in_RSI[uVar4],4);
      uVar3 = uVar4;
      if (pvVar1 == (void *)0x0) break;
      uVar4 = uVar4 + 1;
      uVar3 = 0xffffffffffffffff;
    } while (in_RDI != uVar4);
  }
  sVar2 = ::std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                    (&local_38," \t\n\r",0xffffffffffffffff,4);
  uVar4 = uVar3;
  if (uVar3 == 0xffffffffffffffff) {
    uVar4 = local_38._M_len;
  }
  if (local_38._M_len < uVar4) {
    ::std::__throw_out_of_range_fmt
              ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr");
  }
  uVar3 = (sVar2 - uVar3) + 1;
  if (local_38._M_len - uVar4 < uVar3) {
    uVar3 = local_38._M_len - uVar4;
  }
  sVar5._M_str = local_38._M_str + uVar4;
  sVar5._M_len = uVar3;
  return sVar5;
}

Assistant:

string_view trim(string_view str)
	{
		auto const first = str.find_first_not_of(" \t\n\r");
		auto const last = str.find_last_not_of(" \t\n\r");
		return str.substr(first == string_view::npos ? str.size() : first, last - first + 1);
	}